

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xpath_ast_node * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_expression_rec
          (xpath_parser *this,xpath_ast_node *lhs,int limit)

{
  xpath_value_type xVar1;
  char *pcVar2;
  xpath_ast_node *pxVar3;
  int in_EDX;
  xpath_parser *in_RSI;
  xpath_ast_node *in_RDI;
  binary_op_t bVar4;
  binary_op_t nextop;
  xpath_ast_node *rhs;
  binary_op_t op;
  char *in_stack_ffffffffffffff48;
  undefined6 in_stack_ffffffffffffff50;
  undefined1 uVar5;
  undefined1 uVar6;
  xpath_ast_node *in_stack_ffffffffffffff60;
  xpath_value_type in_stack_ffffffffffffff68;
  ast_type_t in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  ast_type_t in_stack_ffffffffffffff74;
  undefined8 local_80;
  int local_78;
  undefined8 local_60;
  int local_58;
  undefined8 local_4c;
  int local_44;
  xpath_ast_node *local_40;
  xpath_ast_node *local_38;
  xpath_value_type local_30;
  int local_28;
  
  bVar4 = binary_op_t::parse((xpath_lexer *)in_stack_ffffffffffffff60);
  local_38 = bVar4._0_8_;
  _local_28 = local_38;
  local_30 = bVar4.precedence;
  while( true ) {
    pxVar3 = _local_28;
    uVar6 = local_28 != 0 && in_EDX <= (int)local_30;
    if (local_28 == 0 || in_EDX > (int)local_30) {
      return (xpath_ast_node *)in_RSI;
    }
    xpath_lexer::next((xpath_lexer *)&in_RDI->_left);
    pcVar2 = &(in_RDI[2]._next)->_rettype;
    in_RDI[2]._next = (xpath_ast_node *)pcVar2;
    if ((char *)0x400 < pcVar2) {
      pxVar3 = error_rec((xpath_parser *)0xee32e4);
      return pxVar3;
    }
    local_40 = parse_path_or_unary_expression
                         ((xpath_parser *)
                          CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    if (local_40 == (xpath_ast_node *)0x0) {
      return (xpath_ast_node *)0x0;
    }
    bVar4 = binary_op_t::parse((xpath_lexer *)in_stack_ffffffffffffff60);
    local_60 = bVar4._0_8_;
    local_4c = local_60;
    local_58 = bVar4.precedence;
    local_44 = local_58;
    while( true ) {
      uVar5 = (int)local_4c != 0 && (int)local_30 < local_44;
      if ((int)local_4c == 0 || (int)local_30 >= local_44) break;
      local_40 = parse_expression_rec
                           (in_RSI,(xpath_ast_node *)CONCAT44(in_EDX,local_30),
                            (int)((ulong)pxVar3 >> 0x20));
      if (local_40 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      bVar4 = binary_op_t::parse((xpath_lexer *)in_stack_ffffffffffffff60);
      local_80 = bVar4._0_8_;
      local_78 = bVar4.precedence;
      local_4c = local_80;
      local_44 = local_78;
    }
    if ((local_28 == 0xf) &&
       ((xVar1 = xpath_ast_node::rettype((xpath_ast_node *)in_RSI), xVar1 != xpath_type_node_set ||
        (xVar1 = xpath_ast_node::rettype(local_40), xVar1 != xpath_type_node_set)))) break;
    in_RSI = (xpath_parser *)
             alloc_node((xpath_parser *)
                        CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                        in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,
                        in_stack_ffffffffffffff60,in_RDI);
    if (in_RSI == (xpath_parser *)0x0) {
      return (xpath_ast_node *)0x0;
    }
    bVar4 = binary_op_t::parse((xpath_lexer *)in_stack_ffffffffffffff60);
    in_stack_ffffffffffffff60 = bVar4._0_8_;
    in_stack_ffffffffffffff68 = bVar4.precedence;
    in_stack_ffffffffffffff74 = bVar4.asttype;
    _local_28 = in_stack_ffffffffffffff60;
    local_30 = in_stack_ffffffffffffff68;
  }
  pxVar3 = error((xpath_parser *)CONCAT17(uVar6,CONCAT16(uVar5,in_stack_ffffffffffffff50)),
                 in_stack_ffffffffffffff48);
  return pxVar3;
}

Assistant:

xpath_ast_node* parse_expression_rec(xpath_ast_node* lhs, int limit)
		{
			binary_op_t op = binary_op_t::parse(_lexer);

			while (op.asttype != ast_unknown && op.precedence >= limit)
			{
				_lexer.next();

				if (++_depth > xpath_ast_depth_limit)
					return error_rec();

				xpath_ast_node* rhs = parse_path_or_unary_expression();
				if (!rhs) return NULL;

				binary_op_t nextop = binary_op_t::parse(_lexer);

				while (nextop.asttype != ast_unknown && nextop.precedence > op.precedence)
				{
					rhs = parse_expression_rec(rhs, nextop.precedence);
					if (!rhs) return NULL;

					nextop = binary_op_t::parse(_lexer);
				}

				if (op.asttype == ast_op_union && (lhs->rettype() != xpath_type_node_set || rhs->rettype() != xpath_type_node_set))
					return error("Union operator has to be applied to node sets");

				lhs = alloc_node(op.asttype, op.rettype, lhs, rhs);
				if (!lhs) return NULL;

				op = binary_op_t::parse(_lexer);
			}

			return lhs;
		}